

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void mpc_input_rewind(mpc_input_t *i)

{
  undefined4 uVar1;
  mpc_state_t *pmVar2;
  mpc_input_t *i_local;
  
  if (0 < i->backtrack) {
    pmVar2 = i->marks + (i->marks_num + -1);
    (i->state).pos = pmVar2->pos;
    (i->state).row = pmVar2->row;
    (i->state).col = pmVar2->col;
    uVar1 = *(undefined4 *)&pmVar2->field_0x1c;
    (i->state).term = pmVar2->term;
    *(undefined4 *)&(i->state).field_0x1c = uVar1;
    i->last = i->lasts[i->marks_num + -1];
    if (i->type == 1) {
      fseek((FILE *)i->file,(i->state).pos,0);
    }
    mpc_input_unmark(i);
  }
  return;
}

Assistant:

static void mpc_input_rewind(mpc_input_t *i) {

  if (i->backtrack < 1) { return; }

  i->state = i->marks[i->marks_num-1];
  i->last  = i->lasts[i->marks_num-1];

  if (i->type == MPC_INPUT_FILE) {
    fseek(i->file, i->state.pos, SEEK_SET);
  }

  mpc_input_unmark(i);
}